

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall
helics::apps::Recorder::buildArgParserApp(Recorder *this)

{
  Option *pOVar1;
  App *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  allocator<char> local_2c1;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[42]>((char (*) [42])this);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"--allow_iteration",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"allow iteration on values",&local_2c1);
  pOVar1 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar2,&local_40,(bool *)(in_RSI + 0xa0),&local_60);
  CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"--marker",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "print a statement indicating time advancement every <arg> period during the simulation"
             ,&local_2c1);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_80,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0xa8),&local_a0)
  ;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"--verbose",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"print all value results to the screen",&local_2c1);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar2,&local_c0,(bool *)(in_RSI + 0xa1),&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"--mapfile",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"write progress to a map file for concurrent progress monitoring",
             &local_2c1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x298),
             &local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"--output,-o",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"the output file for recording the data",&local_2c1);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_140,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x60),&local_160);
  CLI::Option::capture_default_str(pOVar1);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"cloning",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "Options related to endpoint cloning operations and specifications",&local_2c1);
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_180,&local_1a0)->super_App;
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"--clone",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[52],_(CLI::detail::enabler)0>
                     (pAVar2,&local_1c0,
                      (char (*) [52])"existing endpoints to clone all packets to and from");
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:640:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:640:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"--sourceclone",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[99],_(CLI::detail::enabler)0>
                     (pAVar2,&local_1e0,
                      (char (*) [99])
                      "existing endpoints to capture generated packets from, this argument may be specified multiple time"
                     );
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:651:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:651:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"--destclone",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[133],_(CLI::detail::enabler)0>
                     (pAVar2,&local_200,
                      (char (*) [133])
                      "existing endpoints to capture all packets with the specified endpoint as a destination, this argument may be specified multiple time"
                     );
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:660:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:660:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_200);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"capture_group",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "Options related to capturing publications, endpoints, or federates",&local_2c1);
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_220,&local_240)->super_App;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"--tag,--publication,--pub",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[81],_(CLI::detail::enabler)0>
                     (pAVar2,&local_260,
                      (char (*) [81])
                      "tags(publications) to record, this argument may be specified any number of times"
                     );
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:672:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:672:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"--endpoints",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[67],_(CLI::detail::enabler)0>
                     (pAVar2,&local_280,
                      (char (*) [67])
                      "endpoints to capture, this argument may be specified multiple time");
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:683:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:683:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"--capture",&local_2c1);
  pOVar1 = CLI::App::add_option<const_char[139],_(CLI::detail::enabler)0>
                     (pAVar2,&local_2a0,
                      (char (*) [139])
                      "capture all the publications of a particular federate capture=\"fed1;fed2\"  supports multiple arguments or a semicolon/comma separated list"
                     );
  local_2c0.super__Function_base._M_functor._8_8_ = 0;
  local_2c0._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:695:16)>
       ::_M_invoke;
  local_2c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:695:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_2c0);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  CLI::std::_Function_base::~_Function_base(&local_2c0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_2a0);
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> Recorder::buildArgParserApp()
{
    using gmlc::utilities::stringOps::removeQuotes;
    using gmlc::utilities::stringOps::splitlineQuotes;

    auto app = std::make_shared<helicsCLI11App>("Command line options for the Recorder App");
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();
    app->add_option(
        "--marker",
        nextPrintTimeStep,
        "print a statement indicating time advancement every <arg> period during the simulation");
    app->add_flag("--verbose", verbose, "print all value results to the screen");
    app->add_option("--mapfile",
                    mapfile,
                    "write progress to a map file for concurrent progress monitoring");

    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();

    auto* clone_group =
        app->add_option_group("cloning",
                              "Options related to endpoint cloning operations and specifications");
    clone_group->add_option("--clone", "existing endpoints to clone all packets to and from")
        ->each([this](const std::string& clone) {
            addDestEndpointClone(clone);
            addSourceEndpointClone(clone);
        })
        ->delimiter(',')
        ->type_size(-1);

    clone_group
        ->add_option(
            "--sourceclone",
            "existing endpoints to capture generated packets from, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    clone_group
        ->add_option("--destclone",
                     "existing endpoints to capture all packets with the specified endpoint as a "
                     "destination, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    auto* capture_group =
        app->add_option_group("capture_group",
                              "Options related to capturing publications, endpoints, or federates");
    capture_group
        ->add_option(
            "--tag,--publication,--pub",
            "tags(publications) to record, this argument may be specified any number of times")
        ->each([this](const std::string& tag) {
            auto taglist = splitlineQuotes(tag);
            for (const auto& tagname : taglist) {
                subkeys.emplace(removeQuotes(tagname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--endpoints",
                     "endpoints to capture, this argument may be specified multiple time")
        ->each([this](const std::string& ept) {
            auto eptlist = splitlineQuotes(ept);
            for (const auto& eptname : eptlist) {
                eptNames.emplace(removeQuotes(eptname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--capture",
                     "capture all the publications of a particular federate capture=\"fed1;fed2\"  "
                     "supports multiple arguments or a semicolon/comma separated list")
        ->each([this](const std::string& capt) {
            auto captFeds = splitlineQuotes(capt);
            for (auto& captFed : captFeds) {
                auto actCapt = removeQuotes(captFed);
                captureInterfaces.push_back(actCapt);
            }
        })
        ->type_size(-1);

    return app;
}